

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayoutState::deleteCentralWidgetItem(QMainWindowLayoutState *this)

{
  long in_RDI;
  
  if (*(long **)(in_RDI + 0x138) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x138) + 8))();
  }
  *(undefined8 *)(in_RDI + 0x138) = 0;
  return;
}

Assistant:

void QMainWindowLayoutState::deleteCentralWidgetItem()
{
#if QT_CONFIG(dockwidget)
    delete dockAreaLayout.centralWidgetItem;
    dockAreaLayout.centralWidgetItem = nullptr;
#else
    delete centralWidgetItem;
    centralWidgetItem = 0;
#endif
}